

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedFieldNoLock(MapFieldBase *this)

{
  bool bVar1;
  CppType CVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int value;
  ReflectionPayload *this_00;
  reference this_01;
  Reflection *this_02;
  Descriptor *this_03;
  FieldDescriptor *this_04;
  FieldDescriptor *this_05;
  reference message;
  int64_t iVar5;
  uint64_t uVar6;
  Message *this_06;
  Message *from;
  float value_00;
  double value_01;
  string_view sVar7;
  string local_e0;
  string_view local_c0;
  undefined1 local_b0 [8];
  MapValueRef map_val;
  undefined1 local_80 [8];
  MapKey map_key;
  ScratchSpace map_key_scratch_space;
  Message *elem;
  iterator __end2;
  iterator __begin2;
  RepeatedPtrField<google::protobuf::Message> *__range2;
  FieldDescriptor *val_des;
  FieldDescriptor *key_des;
  Descriptor *descriptor;
  Reflection *reflection;
  Message *prototype;
  RepeatedPtrField<google::protobuf::Message> *rep;
  MapFieldBase *this_local;
  
  ClearMapNoSync(this);
  this_00 = payload(this);
  bVar1 = RepeatedPtrField<google::protobuf::Message>::empty(&this_00->repeated_field);
  if (!bVar1) {
    this_01 = RepeatedPtrField<google::protobuf::Message>::operator[](&this_00->repeated_field,0);
    this_02 = Message::GetReflection(this_01);
    this_03 = Message::GetDescriptor(this_01);
    this_04 = Descriptor::map_key(this_03);
    this_05 = Descriptor::map_value(this_03);
    __end2 = RepeatedPtrField<google::protobuf::Message>::begin(&this_00->repeated_field);
    elem = (Message *)RepeatedPtrField<google::protobuf::Message>::end(&this_00->repeated_field);
    while( true ) {
      bVar1 = internal::operator!=(&__end2,(iterator *)&elem);
      if (!bVar1) break;
      message = RepeatedPtrIterator<google::protobuf::Message>::operator*(&__end2);
      Reflection::ScratchSpace::ScratchSpace((ScratchSpace *)&map_key.type_);
      MapKey::MapKey((MapKey *)local_80);
      CVar2 = FieldDescriptor::cpp_type(this_04);
      switch(CVar2) {
      case CPPTYPE_INT32:
        iVar3 = Reflection::GetInt32(this_02,message,this_04);
        MapKey::SetInt32Value((MapKey *)local_80,iVar3);
        break;
      case CPPTYPE_INT64:
        iVar5 = Reflection::GetInt64(this_02,message,this_04);
        MapKey::SetInt64Value((MapKey *)local_80,iVar5);
        break;
      case CPPTYPE_UINT32:
        uVar4 = Reflection::GetUInt32(this_02,message,this_04);
        MapKey::SetUInt32Value((MapKey *)local_80,uVar4);
        break;
      case CPPTYPE_UINT64:
        uVar6 = Reflection::GetUInt64(this_02,message,this_04);
        MapKey::SetUInt64Value((MapKey *)local_80,uVar6);
        break;
      default:
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.cc"
                    ,0x1bc);
      case CPPTYPE_BOOL:
        bVar1 = Reflection::GetBool(this_02,message,this_04);
        MapKey::SetBoolValue((MapKey *)local_80,bVar1);
        break;
      case CPPTYPE_STRING:
        sVar7 = Reflection::GetStringView(this_02,message,this_04,(ScratchSpace *)&map_key.type_);
        map_val.super_MapValueConstRef._8_8_ = sVar7._M_len;
        MapKey::SetStringValue((MapKey *)local_80,sVar7);
      }
      MapValueRef::MapValueRef((MapValueRef *)local_b0);
      CVar2 = FieldDescriptor::cpp_type(this_05);
      MapValueConstRef::SetType((MapValueConstRef *)local_b0,CVar2);
      InsertOrLookupMapValueNoSync(this,(MapKey *)local_80,(MapValueRef *)local_b0);
      CVar2 = FieldDescriptor::cpp_type(this_05);
      switch(CVar2) {
      case CPPTYPE_INT32:
        iVar3 = Reflection::GetInt32(this_02,message,this_05);
        MapValueRef::SetInt32Value((MapValueRef *)local_b0,iVar3);
        break;
      case CPPTYPE_INT64:
        iVar5 = Reflection::GetInt64(this_02,message,this_05);
        MapValueRef::SetInt64Value((MapValueRef *)local_b0,iVar5);
        break;
      case CPPTYPE_UINT32:
        uVar4 = Reflection::GetUInt32(this_02,message,this_05);
        MapValueRef::SetUInt32Value((MapValueRef *)local_b0,uVar4);
        break;
      case CPPTYPE_UINT64:
        uVar6 = Reflection::GetUInt64(this_02,message,this_05);
        MapValueRef::SetUInt64Value((MapValueRef *)local_b0,uVar6);
        break;
      case CPPTYPE_DOUBLE:
        value_01 = Reflection::GetDouble(this_02,message,this_05);
        MapValueRef::SetDoubleValue((MapValueRef *)local_b0,value_01);
        break;
      case CPPTYPE_FLOAT:
        value_00 = Reflection::GetFloat(this_02,message,this_05);
        MapValueRef::SetFloatValue((MapValueRef *)local_b0,value_00);
        break;
      case CPPTYPE_BOOL:
        bVar1 = Reflection::GetBool(this_02,message,this_05);
        MapValueRef::SetBoolValue((MapValueRef *)local_b0,bVar1);
        break;
      case CPPTYPE_ENUM:
        value = Reflection::GetEnumValue(this_02,message,this_05);
        MapValueRef::SetEnumValue((MapValueRef *)local_b0,value);
        break;
      case CPPTYPE_STRING:
        Reflection::GetString_abi_cxx11_(&local_e0,this_02,message,this_05);
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_e0);
        local_c0 = sVar7;
        MapValueRef::SetStringValue((MapValueRef *)local_b0,sVar7);
        std::__cxx11::string::~string((string *)&local_e0);
        break;
      case CPPTYPE_MESSAGE:
        this_06 = MapValueRef::MutableMessageValue((MapValueRef *)local_b0);
        from = Reflection::GetMessage(this_02,message,this_05,(MessageFactory *)0x0);
        Message::CopyFrom(this_06,from);
      }
      Reflection::ScratchSpace::~ScratchSpace((ScratchSpace *)&map_key.type_);
      RepeatedPtrIterator<google::protobuf::Message>::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void MapFieldBase::SyncMapWithRepeatedFieldNoLock() {
  ClearMapNoSync();

  RepeatedPtrField<Message>& rep = payload().repeated_field;

  if (rep.empty()) return;

  const Message* prototype = &rep[0];
  const Reflection* reflection = prototype->GetReflection();
  const Descriptor* descriptor = prototype->GetDescriptor();
  const FieldDescriptor* key_des = descriptor->map_key();
  const FieldDescriptor* val_des = descriptor->map_value();

  for (const Message& elem : rep) {
    // MapKey type will be set later.
    Reflection::ScratchSpace map_key_scratch_space;
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(
            reflection->GetStringView(elem, key_des, map_key_scratch_space));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(elem, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(elem, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(elem, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(elem, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(elem, key_des));
        break;
      default:
        Unreachable();
    }

    MapValueRef map_val;
    map_val.SetType(val_des->cpp_type());
    InsertOrLookupMapValueNoSync(map_key, &map_val);

    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, METHOD)                                    \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                              \
    map_val.Set##METHOD##Value(reflection->Get##METHOD(elem, val_des)); \
    break;
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(BOOL, Bool);
      HANDLE_TYPE(STRING, String);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_ENUM:
        map_val.SetEnumValue(reflection->GetEnumValue(elem, val_des));
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        map_val.MutableMessageValue()->CopyFrom(
            reflection->GetMessage(elem, val_des));
        break;
      }
    }
  }
}